

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O0

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_value_visit(BinBinaryReader *this,Map *value)

{
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  size_t sVar4;
  reference value_00;
  size_t sVar5;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  char *start_8;
  char *start_7;
  char *start_6;
  Value *key;
  size_t i;
  char *start_5;
  size_t position;
  char *start_4;
  char *start_3;
  char *start_2;
  char *start_1;
  char *start;
  uint32_t count;
  uint32_t size;
  Map *value_local;
  BinBinaryReader *this_local;
  
  start._4_4_ = 0;
  start._0_4_ = 0;
  pcVar1 = (this->reader).cur_;
  _count = value;
  value_local = (Map *)this;
  uVar3 = BinaryReader::read(&this->reader,(int)value,in_RDX,in_RCX);
  if ((uVar3 & 1) == 0) {
    this_local._7_1_ = fail_msg(this,"reader.read(value.keyType)",pcVar1);
  }
  else {
    pcVar1 = (this->reader).cur_;
    bVar2 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
            ::is_primitive(_count->keyType);
    if (bVar2) {
      pcVar1 = (this->reader).cur_;
      uVar3 = BinaryReader::read(&this->reader,(int)_count + 1,__buf,in_RCX);
      if ((uVar3 & 1) == 0) {
        this_local._7_1_ = fail_msg(this,"reader.read(value.valueType)",pcVar1);
      }
      else {
        pcVar1 = (this->reader).cur_;
        bVar2 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                ::is_container(_count->valueType);
        if (bVar2) {
          this_local._7_1_ = fail_msg(this,"!ValueHelper::is_container(value.valueType)",pcVar1);
        }
        else {
          pcVar1 = (this->reader).cur_;
          bVar2 = BinaryReader::read<unsigned_int>(&this->reader,(uint *)((long)&start + 4));
          if (bVar2) {
            sVar4 = BinaryReader::position(&this->reader);
            pcVar1 = (this->reader).cur_;
            bVar2 = BinaryReader::read<unsigned_int>(&this->reader,(uint *)&start);
            if (bVar2) {
              for (key = (Value *)0x0; key != (Value *)(ulong)(uint)start;
                  key = (Value *)((long)&(key->
                                         super__Variant_base<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                         ).
                                         super__Move_assign_alias<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                         .
                                         super__Copy_assign_alias<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                         .
                                         super__Move_ctor_alias<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                         .
                                         super__Copy_ctor_alias<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                         .
                                         super__Variant_storage_alias<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                         ._M_u + 1)) {
                value_00 = std::vector<ritobin::Pair,_std::allocator<ritobin::Pair>_>::
                           emplace_back<>(&_count->items);
                pcVar1 = (this->reader).cur_;
                bVar2 = read_value_of(this,&value_00->key,_count->keyType);
                if (!bVar2) {
                  bVar2 = fail_msg(this,"read_value_of(key, value.keyType)",pcVar1);
                  return bVar2;
                }
                pcVar1 = (this->reader).cur_;
                bVar2 = read_value_of(this,&value_00->value,_count->valueType);
                if (!bVar2) {
                  bVar2 = fail_msg(this,"read_value_of(item, value.valueType)",pcVar1);
                  return bVar2;
                }
              }
              pcVar1 = (this->reader).cur_;
              sVar5 = BinaryReader::position(&this->reader);
              if (sVar5 == sVar4 + start._4_4_) {
                this_local._7_1_ = true;
              }
              else {
                this_local._7_1_ = fail_msg(this,"reader.position() == position + size",pcVar1);
              }
            }
            else {
              this_local._7_1_ = fail_msg(this,"reader.read(count)",pcVar1);
            }
          }
          else {
            this_local._7_1_ = fail_msg(this,"reader.read(size)",pcVar1);
          }
        }
      }
    }
    else {
      this_local._7_1_ = fail_msg(this,"ValueHelper::is_primitive(value.keyType)",pcVar1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool read_value_visit(Map& value) noexcept {
            uint32_t size = 0;
            uint32_t count = 0;
            bin_assert(reader.read(value.keyType));
            bin_assert(ValueHelper::is_primitive(value.keyType));
            bin_assert(reader.read(value.valueType));
            bin_assert(!ValueHelper::is_container(value.valueType));
            bin_assert(reader.read(size));
            size_t position = reader.position();
            bin_assert(reader.read(count));
            for (size_t i = 0; i != count; i++) {
                auto& [key, item] = value.items.emplace_back();
                bin_assert(read_value_of(key, value.keyType));
                bin_assert(read_value_of(item, value.valueType));
            }
            bin_assert(reader.position() == position + size);
            return true;
        }